

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Matrix4f.cpp
# Opt level: O1

Matrix4f *
Matrix4f::infinitePerspectiveProjection
          (Matrix4f *__return_storage_ptr__,float fLeft,float fRight,float fBottom,float fTop,
          float fZNear,bool directX)

{
  undefined1 auVar1 [16];
  Matrix4f *projection;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 in_register_00001204 [60];
  undefined1 auVar4 [64];
  undefined1 auVar5 [16];
  undefined1 in_register_00001244 [60];
  undefined1 auVar6 [64];
  undefined1 in_register_00001284 [60];
  undefined1 auVar7 [64];
  undefined1 in_register_000012c4 [60];
  undefined1 auVar8 [64];
  undefined1 in_register_00001304 [12];
  
  auVar8._4_60_ = in_register_000012c4;
  auVar8._0_4_ = fTop;
  auVar7._4_60_ = in_register_00001284;
  auVar7._0_4_ = fBottom;
  auVar6._4_60_ = in_register_00001244;
  auVar6._0_4_ = fRight;
  auVar4._4_60_ = in_register_00001204;
  auVar4._0_4_ = fLeft;
  __return_storage_ptr__->m_elements[0] = 0.0;
  __return_storage_ptr__->m_elements[1] = 0.0;
  __return_storage_ptr__->m_elements[2] = 0.0;
  __return_storage_ptr__->m_elements[3] = 0.0;
  __return_storage_ptr__->m_elements[4] = 0.0;
  __return_storage_ptr__->m_elements[5] = 0.0;
  __return_storage_ptr__->m_elements[6] = 0.0;
  __return_storage_ptr__->m_elements[7] = 0.0;
  __return_storage_ptr__->m_elements[8] = 0.0;
  __return_storage_ptr__->m_elements[9] = 0.0;
  __return_storage_ptr__->m_elements[10] = 0.0;
  __return_storage_ptr__->m_elements[0xb] = 0.0;
  __return_storage_ptr__->m_elements[0xc] = 0.0;
  __return_storage_ptr__->m_elements[0xd] = 0.0;
  __return_storage_ptr__->m_elements[0xe] = 0.0;
  __return_storage_ptr__->m_elements[0xf] = 0.0;
  auVar2 = vinsertps_avx(auVar6._0_16_,auVar8._0_16_,0x10);
  auVar1 = vinsertps_avx(auVar4._0_16_,auVar7._0_16_,0x10);
  auVar5 = vsubps_avx(auVar2,auVar1);
  __return_storage_ptr__->m_elements[0] = (fZNear + fZNear) / auVar5._0_4_;
  auVar3 = vmovshdup_avx(auVar5);
  __return_storage_ptr__->m_elements[5] = (fZNear + fZNear) / auVar3._0_4_;
  auVar3._0_4_ = auVar1._0_4_ + auVar2._0_4_;
  auVar3._4_4_ = auVar1._4_4_ + auVar2._4_4_;
  auVar3._8_4_ = auVar1._8_4_ + auVar2._8_4_;
  auVar3._12_4_ = auVar1._12_4_ + auVar2._12_4_;
  auVar2 = vdivps_avx(auVar3,auVar5);
  auVar5._8_4_ = 0xbf800000;
  auVar5._0_8_ = 0xbf800000bf800000;
  auVar5._12_4_ = 0xbf800000;
  auVar2 = vmovlhps_avx(auVar2,auVar5);
  *(undefined1 (*) [16])(__return_storage_ptr__->m_elements + 8) = auVar2;
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar1._4_12_ = in_register_00001304;
  auVar1._0_4_ = fZNear;
  auVar2 = vxorps_avx512vl(auVar1,auVar2);
  __return_storage_ptr__->m_elements[0xe] =
       (float)((uint)directX * auVar2._0_4_ + (uint)!directX * (int)(fZNear * -2.0));
  return __return_storage_ptr__;
}

Assistant:

Matrix4f Matrix4f::infinitePerspectiveProjection( float fLeft, float fRight,
												 float fBottom, float fTop,
												 float fZNear, bool directX )
{
	Matrix4f projection;

	projection( 0, 0 ) = ( 2.0f * fZNear ) / ( fRight - fLeft );
	projection( 1, 1 ) = ( 2.0f * fZNear ) / ( fTop - fBottom );
	projection( 0, 2 ) = ( fRight + fLeft ) / ( fRight - fLeft );
	projection( 1, 2 ) = ( fTop + fBottom ) / ( fTop - fBottom );
	projection( 3, 2 ) = -1;

	// infinite view frustum
	// just take the limit as far --> inf of the regular frustum
	if( directX )
	{
		projection( 2, 2 ) = -1.0f;
		projection( 2, 3 ) = -fZNear;		
	}
	else
	{
		projection( 2, 2 ) = -1.0f;
		projection( 2, 3 ) = -2.0f * fZNear;
	}

	return projection;
}